

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

cio_http_location_handler * alloc_handler_for_callback_test(void *config)

{
  cio_http_data_cb_t p_Var1;
  cio_http_location_handler *handler;
  request_test *test;
  
  handler = (cio_http_location_handler *)malloc(0xa8);
  if (handler != (cio_http_location_handler *)0x0) {
    cio_http_location_handler_init(handler);
    handler[1].on_schema = (cio_http_data_cb_t)(handler + 1);
    handler[1].on_url = (cio_http_data_cb_t)(handler + 1);
    handler[1].on_host = (cio_http_data_cb_t)0x0;
    handler[1].on_port = (cio_http_data_cb_t)0x0;
    handler->free = free_dummy_handler;
    p_Var1 = *(cio_http_data_cb_t *)((long)config + 0x40);
    handler->on_header_field_name = *(cio_http_data_cb_t *)((long)config + 0x38);
    handler->on_header_field_value = p_Var1;
    handler->on_url = *(cio_http_data_cb_t *)((long)config + 0x30);
    p_Var1 = *(cio_http_data_cb_t *)((long)config + 0x50);
    handler->on_headers_complete = *(cio_http_cb_t *)((long)config + 0x48);
    handler->on_body = p_Var1;
    handler->on_message_complete = *(cio_http_cb_t *)((long)config + 0x58);
    p_Var1 = *(cio_http_data_cb_t *)((long)config + 8);
    handler->on_schema = *config;
    handler->on_host = p_Var1;
    p_Var1 = *(cio_http_data_cb_t *)((long)config + 0x18);
    handler->on_port = *(cio_http_data_cb_t *)((long)config + 0x10);
    handler->on_path = p_Var1;
    p_Var1 = *(cio_http_data_cb_t *)((long)config + 0x28);
    handler->on_query = *(cio_http_data_cb_t *)((long)config + 0x20);
    handler->on_fragment = p_Var1;
    on_schema_fake.return_val = *(cio_http_cb_return *)((long)config + 0x68);
    on_host_fake.return_val = on_schema_fake.return_val;
    on_port_fake.return_val = on_schema_fake.return_val;
    on_path_fake.return_val = on_schema_fake.return_val;
    on_query_fake.return_val = on_schema_fake.return_val;
    on_fragment_fake.return_val = on_schema_fake.return_val;
  }
  return handler;
}

Assistant:

static struct cio_http_location_handler *alloc_handler_for_callback_test(const void *config)
{
	struct dummy_handler *handler = malloc(sizeof(*handler));
	if (cio_unlikely(handler == NULL)) {
		return NULL;
	} else {
		const struct request_test *test = (const struct request_test *)config;
		cio_http_location_handler_init(&handler->handler);
		cio_write_buffer_head_init(&handler->wbh);
		handler->handler.free = free_dummy_handler;
		handler->handler.on_header_field_name = test->on_header_field_name;
		handler->handler.on_header_field_value = test->on_header_field_value;
		handler->handler.on_url = test->on_url;
		handler->handler.on_headers_complete = test->on_header_complete;
		handler->handler.on_body = test->on_body;
		handler->handler.on_message_complete = test->on_message_complete;
		handler->handler.on_schema = test->on_scheme;
		handler->handler.on_host = test->on_host;
		handler->handler.on_port = test->on_port;
		handler->handler.on_path = test->on_path;
		handler->handler.on_query = test->on_query;
		handler->handler.on_fragment = test->on_fragment;

		on_schema_fake.return_val = test->callback_return;
		on_host_fake.return_val = test->callback_return;
		on_port_fake.return_val = test->callback_return;
		on_path_fake.return_val = test->callback_return;
		on_query_fake.return_val = test->callback_return;
		on_fragment_fake.return_val = test->callback_return;

		return &handler->handler;
	}
}